

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O3

int lex_skipeq(LexState *ls)

{
  uint uVar1;
  byte *pbVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = ls->c;
  uVar5 = 0xffffffff;
  uVar6 = uVar1;
  do {
    pcVar4 = (ls->sb).w;
    if (*(int *)&(ls->sb).e == (int)pcVar4) {
      pcVar4 = lj_buf_more2(&ls->sb,1);
    }
    *pcVar4 = (char)uVar6;
    (ls->sb).w = pcVar4 + 1;
    pbVar2 = (byte *)ls->p;
    if (pbVar2 < ls->pe) {
      ls->p = (char *)(pbVar2 + 1);
      uVar3 = (uint)*pbVar2;
    }
    else {
      uVar3 = lex_more(ls);
    }
    uVar5 = uVar5 + 1;
    ls->c = uVar3;
  } while ((uVar3 == 0x3d) && (uVar6 = 0x3d, uVar5 < 0x20000000));
  return uVar5 ^ -(uint)(uVar3 != uVar1);
}

Assistant:

static int lex_skipeq(LexState *ls)
{
  int count = 0;
  LexChar s = ls->c;
  lj_assertLS(s == '[' || s == ']', "bad usage");
  while (lex_savenext(ls) == '=' && count < 0x20000000)
    count++;
  return (ls->c == s) ? count : (-count) - 1;
}